

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

bool __thiscall OpenGliderConnection::ProcessFetchedData(OpenGliderConnection *this)

{
  bool bVar1;
  logLevelTy lVar2;
  int iVar3;
  DatRequTy masterDataType;
  uint uVar4;
  time_t tVar5;
  ulong uVar6;
  size_type sVar7;
  undefined8 uVar8;
  FDStaticData *inStat;
  undefined4 extraout_var;
  FlarmAircraftTy *pFVar9;
  char *pcVar10;
  string *psVar11;
  string *psVar12;
  double *pdVar13;
  FDDynamicData *in_RDI;
  double dVar14;
  positionTy *this_00;
  double dVar15;
  double dAlt_m;
  undefined1 bAllowNanAltIfGnd;
  system_error *e;
  positionTy pos;
  FDDynamicData dyn;
  FlarmAircraftTy acTy;
  lock_guard<std::recursive_mutex> fdLock;
  LTFlightData *fd;
  unique_lock<std::mutex> mapFdLock;
  FDStaticData stat;
  FDKeyTy fdKey;
  long age_s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tok;
  string sMarker;
  char *sEnd;
  char *sPos;
  positionTy viewPos;
  time_t tNow;
  string acFilter;
  char buf [100];
  positionTy *in_stack_fffffffffffffa78;
  FDStaticData *in_stack_fffffffffffffa80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa90;
  logLevelTy in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  mapped_type *in_stack_fffffffffffffaa0;
  positionTy *in_stack_fffffffffffffab0;
  DataRefs *in_stack_fffffffffffffab8;
  FlarmAircraftTy _acTy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  double in_stack_fffffffffffffae8;
  positionTy *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  bool local_4c2;
  undefined4 in_stack_fffffffffffffb60;
  logLevelTy in_stack_fffffffffffffb64;
  allocator *paVar16;
  string local_450 [32];
  positionTy local_430;
  FDStaticData *in_stack_fffffffffffffc20;
  FDKeyTy *in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc31;
  OpenGliderConnection *in_stack_fffffffffffffc38;
  positionTy *pos_00;
  FDDynamicData *inDyn;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  int local_398;
  FlarmAircraftTy local_394;
  mapped_type *local_388;
  byte local_369;
  string local_368 [32];
  string local_348 [64];
  string local_308 [64];
  string local_2c8 [32];
  string local_2a8 [144];
  string local_218 [152];
  double local_180;
  allocator<char> local_171;
  string local_170 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  allocator local_131;
  string local_130 [32];
  char *local_110;
  char *local_108;
  long local_a8;
  int local_9c;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [3];
  byte local_1;
  
  DataRefs::GetDebugAcFilter_abi_cxx11_(in_stack_fffffffffffffab8);
  if (in_RDI[2].ts != 0.0) {
    tVar5 = time((time_t *)0x0);
    dVar14 = DataRefs::GetChTsOffset(&dataRefs);
    local_a8 = lround(dVar14);
    local_a8 = tVar5 + local_a8;
    DataRefs::GetViewPos();
    for (local_108 = strstr((char *)in_RDI[2].vsi,"<m a=\""); local_108 != (char *)0x0;
        local_108 = strstr(local_108,"<m a=\"")) {
      local_108 = local_108 + 6;
      local_110 = strstr(local_108,"\"/>");
      if (local_110 == (char *)0x0) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                 ,0x122,"ProcessFetchedData",logERR,
                 "OGN response malformed, end of XML element missing: %s",local_108);
        }
        break;
      }
      uVar6 = (long)local_110 - (long)local_108;
      paVar16 = &local_131;
      pcVar10 = local_108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,pcVar10,uVar6,paVar16);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                 (allocator<char> *)in_stack_fffffffffffffab0);
      str_tokenize(in_stack_fffffffffffffaf8,(string *)in_stack_fffffffffffffaf0,
                   SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator(&local_171);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_150);
      if (sVar7 == 0xe) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_150,6);
        inStat = (FDStaticData *)
                 std::__cxx11::stol(&in_stack_fffffffffffffa80->reg,
                                    (size_t *)in_stack_fffffffffffffa78,0);
        iVar3 = std::abs((int)inStat);
        dVar15 = (double)CONCAT44(extraout_var,iVar3);
        dVar14 = dVar15;
        local_180 = dVar15;
        masterDataType = DataRefs::GetFdBufPeriod(&dataRefs);
        if ((long)dVar15 < (long)(int)masterDataType) {
          LTFlightData::FDKeyTy::FDKeyTy((FDKeyTy *)in_stack_fffffffffffffa80);
          LTFlightData::FDStaticData::FDStaticData(in_stack_fffffffffffffa80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_150,0xc);
          bVar1 = AcListLookup(in_stack_fffffffffffffc38,
                               (string *)
                               CONCAT71(in_stack_fffffffffffffc31,in_stack_fffffffffffffc30),
                               in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          if (bVar1) {
            uVar4 = std::__cxx11::string::empty();
            local_369 = 0;
            local_4c2 = false;
            if ((uVar4 & 1) == 0) {
              std::__cxx11::string::string(local_368,local_98);
              local_369 = 1;
              local_4c2 = LTFlightData::FDKeyTy::operator!=
                                    ((FDKeyTy *)in_stack_fffffffffffffa80,
                                     (string *)in_stack_fffffffffffffa78);
            }
            if ((local_369 & 1) != 0) {
              std::__cxx11::string::~string(local_368);
            }
            if (local_4c2 == false) {
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffffa80,
                         (mutex_type *)in_stack_fffffffffffffa78);
              local_388 = std::
                          map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                          ::operator[]((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                                        *)in_stack_fffffffffffffac0,
                                       (key_type *)in_stack_fffffffffffffab8);
              _acTy = (FlarmAircraftTy)((ulong)in_stack_fffffffffffffab8 >> 0x20);
              std::lock_guard<std::recursive_mutex>::lock_guard
                        ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffa80,
                         (mutex_type *)in_stack_fffffffffffffa78);
              std::unique_lock<std::mutex>::unlock
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffffa80);
              bVar1 = LTFlightData::empty((LTFlightData *)0x20b807);
              if (bVar1) {
                LTFlightData::SetKey
                          (in_stack_fffffffffffffaa0,
                           (FDKeyTy *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
                ;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_150,10);
                local_398 = std::__cxx11::stoi(&in_stack_fffffffffffffa80->reg,
                                               (size_t *)in_stack_fffffffffffffa78,0);
                in_stack_fffffffffffffc64 = 0;
                in_stack_fffffffffffffc60 = 0xf;
                pFVar9 = (FlarmAircraftTy *)
                         std::clamp<int>(&local_398,(int *)&stack0xfffffffffffffc64,
                                         (int *)&stack0xfffffffffffffc60);
                local_394 = *pFVar9;
                pcVar10 = OGNGetAcTypeName(local_394);
                std::__cxx11::string::operator=(local_2a8,pcVar10);
                if (local_394 == FAT_STATIC_OBJ) {
                  psVar11 = (string *)std::__cxx11::string::operator=(local_308,"TWR");
                  std::__cxx11::string::operator=(local_348,psVar11);
                }
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) != 0) {
                  psVar12 = OGNGetIcaoAcType_abi_cxx11_(_acTy);
                  std::__cxx11::string::operator=(local_308,(string *)psVar12);
                }
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) != 0) {
                  std::__cxx11::string::operator=(local_2c8,local_2a8);
                }
              }
              LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)in_stack_fffffffffffffa80)
              ;
              this_00 = (positionTy *)(double)(local_a8 - (long)local_180);
              in_stack_fffffffffffffc30 = 0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_150,7);
              in_stack_fffffffffffffc38 =
                   (OpenGliderConnection *)
                   std::__cxx11::stod(&in_stack_fffffffffffffa80->reg,
                                      (size_t *)in_stack_fffffffffffffa78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_150,8);
              in_stack_fffffffffffffaf8 =
                   (string *)
                   std::__cxx11::stod(&in_stack_fffffffffffffa80->reg,
                                      (size_t *)in_stack_fffffffffffffa78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_150,9);
              in_stack_fffffffffffffaf0 =
                   (positionTy *)
                   std::__cxx11::stod(&in_stack_fffffffffffffa80->reg,
                                      (size_t *)in_stack_fffffffffffffa78);
              pos_00 = in_stack_fffffffffffffaf0;
              inDyn = in_RDI;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_150,0);
              in_stack_fffffffffffffae8 =
                   std::__cxx11::stod(&in_stack_fffffffffffffa80->reg,
                                      (size_t *)in_stack_fffffffffffffa78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_150,1);
              dVar15 = std::__cxx11::stod(&in_stack_fffffffffffffa80->reg,
                                          (size_t *)in_stack_fffffffffffffa78);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_150,4);
              dAlt_m = std::__cxx11::stod(&in_stack_fffffffffffffa80->reg,
                                          (size_t *)in_stack_fffffffffffffa78);
              positionTy::positionTy
                        (&local_430,in_stack_fffffffffffffae8,dVar15,dAlt_m,(double)this_00,
                         (double)in_stack_fffffffffffffc38,NAN,NAN,GND_UNKNOWN,UNIT_WORLD,UNIT_DEG,
                         FPH_UNKNOWN);
              local_430.f._1_1_ = local_430.f._1_1_ & 0xfc;
              in_stack_fffffffffffffac0 = local_78;
              pdVar13 = positionTy::lat(&local_430);
              in_stack_fffffffffffffab0 = (positionTy *)*pdVar13;
              in_stack_fffffffffffffab8 = (DataRefs *)positionTy::lon(&local_430);
              snprintf((char *)in_stack_fffffffffffffac0,100,
                       "http://live.glidernet.org/#c=%.5f,%.5f&z=9&s=1",in_stack_fffffffffffffab0,
                       *(double *)in_stack_fffffffffffffab8);
              std::__cxx11::string::operator=(local_218,(char *)local_78);
              in_stack_fffffffffffffaa0 = local_388;
              dVar15 = positionTy::dist((positionTy *)in_stack_fffffffffffffa80,
                                        in_stack_fffffffffffffa78);
              bAllowNanAltIfGnd = (undefined1)((ulong)dVar15 >> 0x38);
              LTFlightData::UpdateData
                        ((LTFlightData *)
                         CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),inStat,dVar14
                         ,masterDataType);
              bVar1 = positionTy::isNormal(in_stack_fffffffffffffab0,(bool)bAllowNanAltIfGnd);
              in_stack_fffffffffffffa9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa9c);
              if (bVar1) {
                LTFlightData::AddDynData
                          ((LTFlightData *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),inDyn,
                           (int)((ulong)this_00 >> 0x20),(int)this_00,pos_00);
              }
              else {
                in_stack_fffffffffffffa98 = DataRefs::GetLogLevel(&dataRefs);
                if ((int)in_stack_fffffffffffffa98 < 1) {
                  in_stack_fffffffffffffa90 =
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x20bd06);
                  positionTy::dbgTxt_abi_cxx11_(this_00);
                  in_stack_fffffffffffffa78 = (positionTy *)std::__cxx11::string::c_str();
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                         ,0x189,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",
                         in_stack_fffffffffffffa90);
                  std::__cxx11::string::~string(local_450);
                }
              }
              std::lock_guard<std::recursive_mutex>::~lock_guard
                        ((lock_guard<std::recursive_mutex> *)0x20bda5);
              std::unique_lock<std::mutex>::~unique_lock
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffffa80);
              local_9c = 0;
            }
            else {
              local_9c = 4;
            }
          }
          else {
            local_9c = 4;
          }
          LTFlightData::FDStaticData::~FDStaticData(in_stack_fffffffffffffa80);
          LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x20beb0);
        }
        else {
          local_9c = 4;
        }
      }
      else {
        in_stack_fffffffffffffb64 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)in_stack_fffffffffffffb64 < 4) {
          uVar8 = std::__cxx11::string::c_str();
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                 ,0x12a,"ProcessFetchedData",logERR,
                 "OGN response contains wrong number of fields: %s",uVar8);
        }
        local_9c = 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_130);
      if ((local_9c != 0) && (local_9c == 2)) break;
    }
  }
  local_1 = 1;
  local_9c = 1;
  std::__cxx11::string::~string(local_98);
  return (bool)(local_1 & 1);
}

Assistant:

bool OpenGliderConnection::ProcessFetchedData ()
{
    char buf[100];

    // any a/c filter defined for debugging purposes?
    std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // We need current Zulu time to interpret the timestamp in the data
    const std::time_t tNow = std::time(nullptr) + std::lround(dataRefs.GetChTsOffset());
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();

    // Search for all markers in the response
    for (const char* sPos = strstr(netData, OGN_MARKER_BEGIN);
         sPos != nullptr;
         sPos = strstr(sPos, OGN_MARKER_BEGIN))
    {
        // increase sPos to actual begining of definition
        sPos += OGN_MARKER_BEGIN_LEN;
        
        // find the end of the marker definition
        const char* sEnd = strstr(sPos, OGN_MARKER_END);
        if (!sEnd) {
            LOG_MSG(logERR, ERR_OGN_XLM_END_MISSING, sPos);
            break;
        }
        
        // then this is the marker definition to work on
        const std::string sMarker (sPos, std::string::size_type(sEnd-sPos));
        std::vector<std::string> tok = str_tokenize(sMarker, ",", false);
        if (tok.size() != GNF_COUNT) {
            LOG_MSG(logERR, ERR_OGN_WRONG_NUM_FIELDS, sMarker.c_str());
            break;
        }
        
        // We skip records, which are outdated by the time they arrive
        const long age_s = std::abs(std::stol(tok[GNF_AGE_S]));
        if (age_s >= dataRefs.GetFdBufPeriod())
            continue;

        // Look up the device in the DDB / Aircraft list.
        // This also checks if the device wants to be tracked and sets the key accordingly
        LTFlightData::FDKeyTy fdKey;
        LTFlightData::FDStaticData stat;
        if (!AcListLookup(tok[GNF_FLARM_DEVICE_ID], fdKey, stat))
            continue;                   // device doesn't want to be tracked -> ignore!
        
        // key not matching a/c filter? -> skip it
        if ((!acFilter.empty() && (fdKey != acFilter)) )
            continue;
        
        try {
            // from here on access to fdMap guarded by a mutex
            // until FD object is inserted and updated
            std::unique_lock<std::mutex> mapFdLock (mapFdMutex);
            
            // get the fd object from the map
            // this fetches an existing or, if not existing, creates a new one
            LTFlightData& fd = mapFd[fdKey];
            
            // also get the data access lock once and for all
            // so following fetch/update calls only make quick recursive calls
            std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
            // now that we have the detail lock we can release the global one
            mapFdLock.unlock();

            // completely new? fill key fields and define static data
            // (for OGN some data we only define initially,
            //  ICAO a/c type derivation has a random element
            //  (if more than one ICAO type is defined))
            if ( fd.empty() ) {
                fd.SetKey(fdKey);
            
                // Aircraft type converted from Flarm AcftType
                const FlarmAircraftTy acTy = (FlarmAircraftTy)std::clamp<int>(std::stoi(tok[GNF_FLARM_ACFT_TYPE]),
                                                                              FAT_UNKNOWN, FAT_STATIC_OBJ);
                stat.catDescr   = OGNGetAcTypeName(acTy);

                // Static objects are always mapped to TWR, all others can be configured by the user
                if (acTy == FAT_STATIC_OBJ) {
                    stat.reg = stat.acTypeIcao = STATIC_OBJECT_TYPE;
                }
                
                // If we still have no accurate ICAO type then we need to fall back to some configured defaults
                if (stat.acTypeIcao.empty())
                    stat.acTypeIcao = OGNGetIcaoAcType(acTy);
                if (stat.mdl.empty())
                    stat.mdl        = stat.catDescr;
            }
                        
            // dynamic data
            {   // unconditional...block is only for limiting local variables
                LTFlightData::FDDynamicData dyn;
                
                // position time: zulu time is given in the data, but it is even easier
                //                when using the age, which is always given relative to the query time
                dyn.ts = double(tNow - age_s);
                
                // non-positional dynamic data
                dyn.gnd =               false;      // there is no GND indicator in OGN data
                dyn.heading =           std::stod(tok[GNF_TRK]);
                dyn.spd =               std::stod(tok[GNF_SPEED_KM_H]) * NM_per_KM;
                dyn.vsi =               std::stod(tok[GNF_VERT_M_S]);
                dyn.pChannel =          this;
                
                // position
                positionTy pos (std::stod(tok[GNF_LAT]),
                                std::stod(tok[GNF_LON]),
                                std::stod(tok[GNF_ALT_M]),
// no weather correction, OGN delivers geo altitude?   dataRefs.WeatherAltCorr_m(std::stod(tok[GNF_ALT_M])),
                                dyn.ts,
                                dyn.heading);
                pos.f.onGrnd = GND_UNKNOWN;         // there is no GND indicator in OGN data
                
                // Update the slug with current position
                snprintf(buf, sizeof(buf), OPGLIDER_CHECK_URL,
                         pos.lat(), pos.lon());
                stat.slug = buf;
                // Update static data
                fd.UpdateData(std::move(stat), pos.dist(viewPos));
                
                // position is rather important, we check for validity
                // (we do allow alt=NAN if on ground)
                if ( pos.isNormal(true) )
                    fd.AddDynData(dyn, 0, 0, &pos);
                else
                    LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
            }
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        }
    }
    
    // success
    return true;
}